

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::make_multipart_data_boundary_abi_cxx11_(void)

{
  result_type_conflict rVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool bVar3;
  initializer_list<unsigned_int> __il;
  allocator<char> local_2751;
  seed_seq seed_sequence;
  mt19937 engine;
  random_device seed_gen;
  
  std::random_device::random_device(&seed_gen);
  engine._M_x[0]._0_4_ = std::random_device::_M_getval();
  engine._M_x[0]._4_4_ = std::random_device::_M_getval();
  engine._M_x[1]._0_4_ = std::random_device::_M_getval();
  engine._M_x[1]._4_4_ = std::random_device::_M_getval();
  __il._M_len = 4;
  __il._M_array = (iterator)&engine;
  std::seed_seq::seed_seq<unsigned_int,void>(&seed_sequence,__il);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed<std::seed_seq>(&engine,&seed_sequence);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,"--cpp-httplib-multipart-data-",&local_2751);
  iVar2 = 0x10;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&engine);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar1 % 0x3e]
              );
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&seed_sequence);
  std::random_device::~random_device(&seed_gen);
  return in_RDI;
}

Assistant:

inline std::string make_multipart_data_boundary() {
  static const char data[] =
      "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

  // std::random_device might actually be deterministic on some
  // platforms, but due to lack of support in the c++ standard library,
  // doing better requires either some ugly hacks or breaking portability.
  std::random_device seed_gen;

  // Request 128 bits of entropy for initialization
  std::seed_seq seed_sequence{seed_gen(), seed_gen(), seed_gen(), seed_gen()};
  std::mt19937 engine(seed_sequence);

  std::string result = "--cpp-httplib-multipart-data-";

  for (auto i = 0; i < 16; i++) {
    result += data[engine() % (sizeof(data) - 1)];
  }

  return result;
}